

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

void anon_unknown.dwarf_4e541b::ListDependencies
               (cmDependInformation *info,FILE *fout,
               set<const_(anonymous_namespace)::cmDependInformation_*,_std::less<const_(anonymous_namespace)::cmDependInformation_*>,_std::allocator<const_(anonymous_namespace)::cmDependInformation_*>_>
               *visited)

{
  FILE *this;
  bool bVar1;
  reference ppcVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool local_d9;
  string local_d8 [35];
  byte local_b5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long local_88;
  size_type pos;
  string tmp;
  _Self local_58;
  cmDependInformation *local_50;
  cmDependInformation *d;
  iterator __end1;
  iterator __begin1;
  DependencySetType *__range1;
  set<const_(anonymous_namespace)::cmDependInformation_*,_std::less<const_(anonymous_namespace)::cmDependInformation_*>,_std::allocator<const_(anonymous_namespace)::cmDependInformation_*>_>
  *visited_local;
  FILE *fout_local;
  cmDependInformation *info_local;
  
  fout_local = (FILE *)info;
  std::
  set<const_(anonymous_namespace)::cmDependInformation_*,_std::less<const_(anonymous_namespace)::cmDependInformation_*>,_std::allocator<const_(anonymous_namespace)::cmDependInformation_*>_>
  ::insert(visited,(value_type *)&fout_local);
  this = fout_local;
  __end1 = std::
           set<(anonymous_namespace)::cmDependInformation_*,_std::less<(anonymous_namespace)::cmDependInformation_*>,_std::allocator<(anonymous_namespace)::cmDependInformation_*>_>
           ::begin((set<(anonymous_namespace)::cmDependInformation_*,_std::less<(anonymous_namespace)::cmDependInformation_*>,_std::allocator<(anonymous_namespace)::cmDependInformation_*>_>
                    *)fout_local);
  d = (cmDependInformation *)
      std::
      set<(anonymous_namespace)::cmDependInformation_*,_std::less<(anonymous_namespace)::cmDependInformation_*>,_std::allocator<(anonymous_namespace)::cmDependInformation_*>_>
      ::end((set<(anonymous_namespace)::cmDependInformation_*,_std::less<(anonymous_namespace)::cmDependInformation_*>,_std::allocator<(anonymous_namespace)::cmDependInformation_*>_>
             *)this);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&d), bVar1) {
    ppcVar2 = std::_Rb_tree_const_iterator<(anonymous_namespace)::cmDependInformation_*>::operator*
                        (&__end1);
    local_50 = *ppcVar2;
    local_58._M_node =
         (_Base_ptr)
         std::
         set<const_(anonymous_namespace)::cmDependInformation_*,_std::less<const_(anonymous_namespace)::cmDependInformation_*>,_std::allocator<const_(anonymous_namespace)::cmDependInformation_*>_>
         ::find(visited,&local_50);
    tmp.field_2._8_8_ =
         std::
         set<const_(anonymous_namespace)::cmDependInformation_*,_std::less<const_(anonymous_namespace)::cmDependInformation_*>,_std::allocator<const_(anonymous_namespace)::cmDependInformation_*>_>
         ::end(visited);
    bVar1 = std::operator==(&local_58,(_Self *)((long)&tmp.field_2 + 8));
    if (bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::string((string *)&pos,(string *)&local_50->FullPath);
        local_88 = std::__cxx11::string::rfind((char)&pos,0x2e);
        local_b5 = 0;
        local_d9 = false;
        if (local_88 != -1) {
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)&pos);
          local_b5 = 1;
          local_d9 = std::operator!=(&local_a8,".h");
        }
        if ((local_b5 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_a8);
        }
        if (local_d9 != false) {
          std::__cxx11::string::substr((ulong)local_d8,(ulong)&pos);
          std::__cxx11::string::operator=((string *)&pos,local_d8);
          std::__cxx11::string::~string(local_d8);
          uVar4 = std::__cxx11::string::c_str();
          fprintf((FILE *)fout,"%s\n",uVar4);
        }
        std::__cxx11::string::~string((string *)&pos);
      }
      ListDependencies(local_50,fout,visited);
    }
    std::_Rb_tree_const_iterator<(anonymous_namespace)::cmDependInformation_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void ListDependencies(cmDependInformation const* info, FILE* fout,
                      std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation* d : info->DependencySet) {
    if (visited->find(d) == visited->end()) {
      if (!info->FullPath.empty()) {
        std::string tmp = d->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", d->FullPath.c_str());
        }
      }
      ListDependencies(d, fout, visited);
    }
  }
}